

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9_compile_file(jx9 *pEngine,char *zFilePath,jx9_vm **ppOutVm)

{
  undefined1 local_58 [8];
  SyString sScript;
  jx9_int64 nSize;
  void *pMapView;
  jx9_vfs *pjStack_30;
  int rc;
  jx9_vfs *pVfs;
  jx9_vm **ppOutVm_local;
  char *zFilePath_local;
  jx9 *pEngine_local;
  
  if (ppOutVm != (jx9_vm **)0x0) {
    *ppOutVm = (jx9_vm *)0x0;
  }
  pMapView._4_4_ = 0;
  if ((((pEngine == (jx9 *)0x0) || (pEngine->nMagic != 0xf874bcd7)) || (zFilePath == (char *)0x0))
     || (*zFilePath == '\0')) {
    pEngine_local._4_4_ = -0x18;
  }
  else {
    pjStack_30 = pEngine->pVfs;
    if ((pjStack_30 == (jx9_vfs *)0x0) ||
       (pjStack_30->xMmap == (_func_int_char_ptr_void_ptr_ptr_jx9_int64_ptr *)0x0)) {
      pMapView._4_4_ = -2;
    }
    else {
      nSize = 0;
      sScript.nByte = 0;
      sScript._12_4_ = 0;
      pVfs = (jx9_vfs *)ppOutVm;
      ppOutVm_local = (jx9_vm **)zFilePath;
      zFilePath_local = (char *)pEngine;
      pMapView._4_4_ = (*pjStack_30->xMmap)(zFilePath,(void **)&nSize,(jx9_int64 *)&sScript.nByte);
      if (pMapView._4_4_ == 0) {
        local_58 = (undefined1  [8])nSize;
        sScript.zString._0_4_ = sScript.nByte;
        pMapView._4_4_ =
             ProcessScript((jx9 *)zFilePath_local,(jx9_vm **)pVfs,(SyString *)local_58,0,
                           (char *)ppOutVm_local);
        if (pjStack_30->xUnmap != (_func_void_void_ptr_jx9_int64 *)0x0) {
          (*pjStack_30->xUnmap)((void *)nSize,sScript._8_8_);
        }
      }
      else {
        pMapView._4_4_ = -2;
      }
    }
    pEngine_local._4_4_ = pMapView._4_4_;
  }
  return pEngine_local._4_4_;
}

Assistant:

JX9_PRIVATE int jx9_compile_file(jx9 *pEngine, const char *zFilePath, jx9_vm **ppOutVm)
{
	const jx9_vfs *pVfs;
	int rc;
	if( ppOutVm ){
		*ppOutVm = 0;
	}
	rc = JX9_OK; /* cc warning */
	if( JX9_ENGINE_MISUSE(pEngine) || SX_EMPTY_STR(zFilePath) ){
		return JX9_CORRUPT;
	}
#if defined(JX9_ENABLE_THREADS)
	 /* Acquire engine mutex */
	 SyMutexEnter(sJx9MPGlobal.pMutexMethods, pEngine->pMutex); /* NO-OP if sJx9MPGlobal.nThreadingLevel != JX9_THREAD_LEVEL_MULTI */
	 if( sJx9MPGlobal.nThreadingLevel > JX9_THREAD_LEVEL_SINGLE && 
		 JX9_THRD_ENGINE_RELEASE(pEngine) ){
			 return JX9_ABORT; /* Another thread have released this instance */
	 }
#endif
	 /*
	  * Check if the underlying vfs implement the memory map
	  * [i.e: mmap() under UNIX/MapViewOfFile() under windows] function.
	  */
	 pVfs = pEngine->pVfs;
	 if( pVfs == 0 || pVfs->xMmap == 0 ){
		 /* Memory map routine not implemented */
		 rc = JX9_IO_ERR;
	 }else{
		 void *pMapView = 0; /* cc warning */
		 jx9_int64 nSize = 0; /* cc warning */
		 SyString sScript;
		 /* Try to get a memory view of the whole file */
		 rc = pVfs->xMmap(zFilePath, &pMapView, &nSize);
		 if( rc != JX9_OK ){
			 /* Assume an IO error */
			 rc = JX9_IO_ERR;
		 }else{
			 /* Compile the file */
			 SyStringInitFromBuf(&sScript, pMapView, nSize);
			 rc = ProcessScript(&(*pEngine), ppOutVm, &sScript,0,zFilePath);
			 /* Release the memory view of the whole file */
			 if( pVfs->xUnmap ){
				 pVfs->xUnmap(pMapView, nSize);
			 }
		 }
	 }
#if defined(JX9_ENABLE_THREADS)
	 /* Leave engine mutex */
	 SyMutexLeave(sJx9MPGlobal.pMutexMethods, pEngine->pMutex); /* NO-OP if sJx9MPGlobal.nThreadingLevel != JX9_THREAD_LEVEL_MULTI */
#endif
	/* Compilation result */
	return rc;
}